

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseUtils.h
# Opt level: O3

void covenant::consume_blanks<covenant::StrParse>(StrParse *input)

{
  ulong uVar1;
  
  uVar1 = (ulong)input->idx;
  if (uVar1 < (input->str)._M_string_length) {
    do {
      uVar1 = (ulong)(byte)(input->str)._M_dataplus._M_p[uVar1];
      if (0x20 < uVar1) {
        return;
      }
      if ((0x100000600U >> (uVar1 & 0x3f) & 1) == 0) {
        return;
      }
      StrParse::chomp(input);
      uVar1 = (ulong)input->idx;
    } while (uVar1 < (input->str)._M_string_length);
  }
  return;
}

Assistant:

bool empty(void) 
  { 
    return idx >= str.size(); 
  }